

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::FormatTimeInMillisAsSeconds_abi_cxx11_(TimeInMillis ms)

{
  _Setprecision _Var1;
  ostream *poVar2;
  long in_RSI;
  string *in_RDI;
  stringstream ss;
  int local_1c8;
  int local_1c4;
  stringstream local_198 [16];
  undefined1 local_188 [376];
  long local_10;
  
  local_10 = in_RSI;
  std::__cxx11::stringstream::stringstream(local_198);
  poVar2 = (ostream *)std::ostream::operator<<(local_188,std::fixed);
  if (local_10 % 1000 == 0) {
    local_1c4 = 0;
  }
  else {
    if (local_10 % 100 == 0) {
      local_1c8 = 1;
    }
    else {
      local_1c8 = 3;
      if (local_10 % 10 == 0) {
        local_1c8 = 2;
      }
    }
    local_1c4 = local_1c8;
  }
  _Var1 = std::setprecision(local_1c4);
  poVar2 = std::operator<<(poVar2,_Var1);
  std::ostream::operator<<(poVar2,std::showpoint);
  std::ostream::operator<<(local_188,(double)local_10 * 0.001);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_198);
  return in_RDI;
}

Assistant:

std::string FormatTimeInMillisAsSeconds(TimeInMillis ms) {
  ::std::stringstream ss;
  // For the exact N seconds, makes sure output has a trailing decimal point.
  // Sets precision so that we won't have many trailing zeros (e.g., 300 ms
  // will be just 0.3, 410 ms 0.41, and so on)
  ss << std::fixed
     << std::setprecision(
            ms % 1000 == 0 ? 0 : (ms % 100 == 0 ? 1 : (ms % 10 == 0 ? 2 : 3)))
     << std::showpoint;
  ss << (static_cast<double>(ms) * 1e-3);
  return ss.str();
}